

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

void __thiscall
ConfidentialTxIn_AddPeginWitnessStack_Test::TestBody
          (ConfidentialTxIn_AddPeginWitnessStack_Test *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar1
  ;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  char *pcVar6;
  AssertHelper local_3e0;
  Message local_3d8;
  ByteData256 local_3d0;
  string local_3b8 [32];
  undefined1 local_398 [8];
  AssertionResult gtest_ar_3;
  Message local_380;
  string local_378 [32];
  string local_358 [32];
  undefined1 local_338 [8];
  AssertionResult gtest_ar_2;
  Message local_320;
  string local_318 [32];
  string local_2f8 [32];
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_1;
  size_t idx;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_2a8;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *exp_peg_vector;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_280;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *local_268;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *test_peg_vector;
  Message local_258;
  uint local_250;
  uint32_t local_24c;
  undefined1 local_248 [8];
  AssertionResult gtest_ar;
  Message local_230 [2];
  ScriptWitness local_220;
  undefined1 local_200 [8];
  ConfidentialTxIn txin;
  uint32_t target_index;
  undefined1 local_78 [8];
  ByteData exp_data;
  undefined1 local_50 [8];
  ScriptWitness exp_pegin_witness;
  ScriptWitness exp_witness_stack;
  ConfidentialTxIn_AddPeginWitnessStack_Test *this_local;
  
  GetExpectWitnessStack();
  GetExpectPeginWitnessStack();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&target_index,"1234567890",
             (allocator *)
             ((long)&txin.pegin_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData::ByteData((ByteData *)local_78,(string *)&target_index);
  std::__cxx11::string::~string((string *)&target_index);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&txin.pegin_witness_.witness_stack_.
                     super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  txin.pegin_witness_.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 6;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_200,&exp_txid,2,0xfffffffe,&exp_script,
             (ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&exp_blinding_nonce,&exp_asset_entropy,
             &exp_issuance_amount,&exp_inflation_keys,&exp_issuance_amount_rangeproof,
             &exp_inflation_keys_rangeproof,(ScriptWitness *)local_50);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::core::ConfidentialTxIn::AddPeginWitnessStack((ByteData *)&local_220);
      cfd::core::ScriptWitness::~ScriptWitness(&local_220);
    }
  }
  else {
    testing::Message::Message(local_230);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xae,
               "Expected: (txin.AddPeginWitnessStack(exp_data)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_230);
  }
  local_24c = cfd::core::ConfidentialTxIn::GetPeginWitnessStackNum((ConfidentialTxIn *)local_200);
  iVar3 = cfd::core::ScriptWitness::GetWitnessNum();
  local_250 = iVar3 + 1;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_248,"txin.GetPeginWitnessStackNum()",
             "exp_pegin_witness.GetWitnessNum() + 1",&local_24c,&local_250);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
  if (!bVar2) {
    testing::Message::Message(&local_258);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_248);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&test_peg_vector,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xb0,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&test_peg_vector,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&test_peg_vector);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
  cfd::core::ConfidentialTxIn::GetPeginWitness
            ((ScriptWitness *)&exp_peg_vector,(ConfidentialTxIn *)local_200);
  cfd::core::ScriptWitness::GetWitness();
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)&exp_peg_vector);
  local_268 = &local_280;
  cfd::core::ScriptWitness::GetWitness();
  local_2a8 = (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx;
  for (gtest_ar_1.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      sVar1.ptr_ = gtest_ar_1.message_.ptr_,
      pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                         (local_2a8), sVar1.ptr_ < pbVar5;
      gtest_ar_1.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_1.message_.ptr_)->field_0x1) {
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              (local_268,(size_type)gtest_ar_1.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
              (local_2a8,(size_type)gtest_ar_1.message_.ptr_);
    cfd::core::ByteData::GetHex_abi_cxx11_();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)local_2d8,"test_peg_vector[idx].GetHex().c_str()",
               "exp_peg_vector[idx].GetHex().c_str()",pcVar4,pcVar6);
    std::__cxx11::string::~string(local_318);
    std::__cxx11::string::~string(local_2f8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
    if (!bVar2) {
      testing::Message::Message(&local_320);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
                 ,0xb6,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_320);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_320);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
            (local_268,
             (ulong)(uint)txin.pegin_witness_.witness_stack_.
                          super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_338,"test_peg_vector[target_index].GetHex().c_str()",
             "exp_data.GetHex().c_str()",pcVar4,pcVar6);
  std::__cxx11::string::~string(local_378);
  std::__cxx11::string::~string(local_358);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
  if (!bVar2) {
    testing::Message::Message(&local_380);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xb9,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_380);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
  cfd::core::ConfidentialTxIn::GetWitnessHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_398,"txin.GetWitnessHash().GetHex().c_str()",
             "\"d4fa3782068f8f1cef563520691eafbc883d1caf1d928012462644c7148cf1d5\"",pcVar4,
             "d4fa3782068f8f1cef563520691eafbc883d1caf1d928012462644c7148cf1d5");
  std::__cxx11::string::~string(local_3b8);
  cfd::core::ByteData256::~ByteData256(&local_3d0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar2) {
    testing::Message::Message(&local_3d8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xbb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3e0,&local_3d8);
    testing::internal::AssertHelper::~AssertHelper(&local_3e0);
    testing::Message::~Message(&local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)&idx);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_280);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_200);
  cfd::core::ByteData::~ByteData((ByteData *)local_78);
  cfd::core::ScriptWitness::~ScriptWitness((ScriptWitness *)local_50);
  cfd::core::ScriptWitness::~ScriptWitness
            ((ScriptWitness *)
             &exp_pegin_witness.witness_stack_.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(ConfidentialTxIn, AddPeginWitnessStack) {
  ScriptWitness exp_witness_stack = GetExpectWitnessStack();
  ScriptWitness exp_pegin_witness = GetExpectPeginWitnessStack();
  const ByteData exp_data("1234567890");
  uint32_t target_index = 6;

  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script,
      exp_witness_stack, exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof, exp_pegin_witness);
  EXPECT_NO_THROW((txin.AddPeginWitnessStack(exp_data)));
  EXPECT_EQ(txin.GetPeginWitnessStackNum(),
      exp_pegin_witness.GetWitnessNum() + 1);
  const std::vector<ByteData>& test_peg_vector = txin.GetPeginWitness()
      .GetWitness();
  const std::vector<ByteData>& exp_peg_vector = exp_pegin_witness.GetWitness();
  for (size_t idx = 0; idx < exp_peg_vector.size(); ++idx) {
    EXPECT_STREQ(test_peg_vector[idx].GetHex().c_str(),
        exp_peg_vector[idx].GetHex().c_str());
  }
  EXPECT_STREQ(test_peg_vector[target_index].GetHex().c_str(),
      exp_data.GetHex().c_str());
  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(), 
    "d4fa3782068f8f1cef563520691eafbc883d1caf1d928012462644c7148cf1d5");
}